

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

int newupvalue(FuncState *fs,TString *name,expdesc *v)

{
  Proto *o;
  byte bVar1;
  int iVar2;
  Upvaldesc *pUVar3;
  long lVar4;
  long lVar5;
  
  o = fs->f;
  lVar5 = (long)o->sizeupvalues;
  checklimit(fs,fs->nups + 1,0xff,"upvalues");
  iVar2 = o->sizeupvalues;
  if (iVar2 <= (int)(uint)fs->nups) {
    pUVar3 = (Upvaldesc *)luaM_growaux_(fs->ls->L,o->upvalues,&o->sizeupvalues,0x10,0xff,"upvalues")
    ;
    o->upvalues = pUVar3;
    iVar2 = o->sizeupvalues;
  }
  lVar4 = lVar5 << 4;
  for (; lVar5 < iVar2; lVar5 = lVar5 + 1) {
    *(undefined8 *)((long)&o->upvalues->name + lVar4) = 0;
    lVar4 = lVar4 + 0x10;
  }
  bVar1 = fs->nups;
  pUVar3 = o->upvalues;
  pUVar3[bVar1].instack = v->k == VLOCAL;
  pUVar3[bVar1].idx = *(lu_byte *)&v->u;
  pUVar3[bVar1].name = name;
  if (((o->marked & 4) != 0) && ((name->marked & 3) != 0)) {
    luaC_barrier_(fs->ls->L,(GCObject *)o,(GCObject *)name);
    bVar1 = fs->nups;
  }
  fs->nups = bVar1 + 1;
  return (uint)bVar1;
}

Assistant:

static int newupvalue (FuncState *fs, TString *name, expdesc *v) {
  Proto *f = fs->f;
  int oldsize = f->sizeupvalues;
  checklimit(fs, fs->nups + 1, MAXUPVAL, "upvalues");
  luaM_growvector(fs->ls->L, f->upvalues, fs->nups, f->sizeupvalues,
                  Upvaldesc, MAXUPVAL, "upvalues");
  while (oldsize < f->sizeupvalues)
    f->upvalues[oldsize++].name = NULL;
  f->upvalues[fs->nups].instack = (v->k == VLOCAL);
  f->upvalues[fs->nups].idx = cast_byte(v->u.info);
  f->upvalues[fs->nups].name = name;
  luaC_objbarrier(fs->ls->L, f, name);
  return fs->nups++;
}